

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

void __thiscall cpptempl::TokenVar::gettext(TokenVar *this,ostream *stream,data_map *data)

{
  pointer pcVar1;
  data_ptr local_78;
  long *local_60;
  long local_58;
  long local_50 [2];
  string local_40;
  
  pcVar1 = (this->m_key)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->m_key)._M_string_length);
  parse_val(&local_78,&local_40,data);
  (*(local_78.ptr.super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Data
    [1])(&local_60);
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)local_60,local_58);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  local_78._vptr_data_ptr = (_func_int **)&PTR__data_ptr_0020bdb8;
  if (local_78.ptr.super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.ptr.super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline void TokenVar::gettext( std::ostream &stream, data_map &data )
    {
        stream << parse_val(m_key, data)->getvalue() ;
    }